

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O0

void genIR(void)

{
  byte bVar1;
  ast *a;
  ostream *poVar2;
  bool bVar3;
  ofstream out;
  ast *var;
  ast *id;
  ast *func;
  ast *ext;
  ast *node;
  C_IC *in_stack_fffffffffffffba8;
  IrSim *in_stack_fffffffffffffbb0;
  IrSim *in_stack_fffffffffffffbb8;
  C_OP *in_stack_fffffffffffffbd0;
  allocator *paVar4;
  IrSim *in_stack_fffffffffffffbd8;
  undefined7 in_stack_fffffffffffffbe0;
  undefined1 in_stack_fffffffffffffbe7;
  allocator local_409;
  string local_408 [32];
  string local_3e8 [32];
  undefined1 local_3c8 [320];
  int *in_stack_fffffffffffffd78;
  ast *in_stack_fffffffffffffd80;
  undefined1 local_1c8 [424];
  ast *local_20;
  ast *local_18;
  ast *local_10;
  ast *local_8;
  
  local_8 = child(ast_root,1);
  while( true ) {
    bVar3 = false;
    if (local_8 != (ast *)0x0) {
      bVar3 = local_8->type != -1;
    }
    if (!bVar3) break;
    local_10 = child(local_8,1);
    local_18 = child(local_10,2);
    local_20 = child(local_18,1);
    local_1c8._416_8_ = child(local_18,3);
    if (local_18->type != -0x2707) {
      std::operator<<((ostream *)&std::cerr,"Global definition or structure not implemented!\n");
      exit(1);
    }
    Operand::Operand((Operand *)CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0),
                     (char *)in_stack_fffffffffffffbd8);
    IrSim::icFunction(in_stack_fffffffffffffbb8,(C_OP *)in_stack_fffffffffffffbb0);
    IrSim::operator<<(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
    InterCode::~InterCode((InterCode *)in_stack_fffffffffffffbb0);
    Operand::~Operand((Operand *)0x110de3);
    while( true ) {
      in_stack_fffffffffffffbe7 = false;
      if ((ast *)local_1c8._416_8_ != (ast *)0x0) {
        in_stack_fffffffffffffbe7 = *(int *)local_1c8._416_8_ == -0x2706;
      }
      if ((bool)in_stack_fffffffffffffbe7 == false) break;
      a = child((ast *)local_1c8._416_8_,1);
      child(a,2);
      TR_VarDec(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      in_stack_fffffffffffffbd8 = (IrSim *)local_1c8;
      Operand::Operand((Operand *)CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0),
                       (char *)in_stack_fffffffffffffbd8);
      IrSim::icParam(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
      IrSim::operator<<(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
      InterCode::~InterCode((InterCode *)in_stack_fffffffffffffbb0);
      Operand::~Operand((Operand *)0x110ea1);
      local_1c8._416_8_ = child((ast *)local_1c8._416_8_,3);
    }
    child(local_10,3);
    TR_CompSt((ast *)0x110f6c);
    local_8 = child(local_8,2);
  }
  paVar4 = &local_409;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_408,".orig.ir",paVar4);
  std::operator+((char *)in_stack_fffffffffffffbb8,&in_stack_fffffffffffffbb0->tmpVarPrefix);
  std::ofstream::ofstream(local_3c8,local_3e8,0x10);
  std::__cxx11::string::~string(local_3e8);
  std::__cxx11::string::~string(local_408);
  std::allocator<char>::~allocator((allocator<char> *)&local_409);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) != 0) {
    IrSim::printStream((IrSim *)CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0),
                       (ostream *)in_stack_fffffffffffffbd8);
    std::ofstream::close();
  }
  IrSim::optimize(in_stack_fffffffffffffbb0);
  std::ofstream::open(local_3c8,output_file,0x10);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"ERROR: Cannot open ");
    poVar2 = std::operator<<(poVar2,output_file);
    std::ostream::operator<<((ostream *)poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    IrSim::printStream((IrSim *)CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0),
                       (ostream *)in_stack_fffffffffffffbd8);
    std::ofstream::close();
  }
  std::ofstream::~ofstream(local_3c8);
  return;
}

Assistant:

void genIR() {
#if COMPILER_VERSION >= 3
    ast *node = child(ast_root, 1);
    while (node && node->type != NullNode) {
        ast *ext = child(node, 1), *func = child(ext, 2), *id = child(func, 1), *var = child(func, 3);
        if (func->type != FunDec)
            IMP_ME("Global definition or structure");
        irSim << irSim.icFunction(id->lex);
        while (var && var->type == VarList) {
            irSim << irSim.icParam(TR_VarDec(child(child(var, 1), 2)));
            var = child(var, 3);
        }
        TR_CompSt(child(ext, 3));
        node = child(node, 2);
    }
//    irSim.printStream(cout);
#if COMPILER_VERSION == 3
    ofstream out(output_file + string(".orig.ir"));
    if (out.is_open()) {
        irSim.printStream(out);
        out.close();
    }
#endif

    irSim.optimize();

#if COMPILER_VERSION == 3
    out.open(output_file);
#elif COMPILER_VERSION > 3
    ofstream out(output_file + string(".ir"));
#endif
    if (out.is_open()) {
        irSim.printStream(out);
        out.close();
    }
#if COMPILER_VERSION == 3
    else {
        cerr << "ERROR: Cannot open " << output_file << endl;
    }
#endif

#endif
}